

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O2

int SetPWMPololu(POLOLU *pPololu,int channel,int pw)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uchar sendbuf [512];
  
  iVar2 = (int)((double)(pw + -0x5dc) * pPololu->CoefPWs[channel]);
  if (pPololu->bProportionalPWs[channel] == 0) {
    uVar3 = iVar2 + 0x5dc;
  }
  else {
    iVar4 = pPololu->MidPWs[channel];
    if (iVar2 < 0) {
      iVar5 = pPololu->MinPWs[channel] - iVar4;
      iVar6 = -500;
    }
    else {
      iVar5 = pPololu->MaxPWs[channel] - iVar4;
      iVar6 = 500;
    }
    uVar3 = (iVar5 * iVar2) / iVar6 + iVar4;
  }
  uVar1 = pPololu->MaxPWs[channel];
  if ((int)uVar3 < pPololu->MaxPWs[channel]) {
    uVar1 = uVar3;
  }
  if ((int)uVar1 <= pPololu->MinPWs[channel]) {
    uVar1 = pPololu->MinPWs[channel];
  }
  iVar4 = uVar1 - pPololu->LastPWs[channel];
  iVar2 = -iVar4;
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  iVar4 = 0;
  if (pPololu->ThresholdPWs[channel] <= iVar2) {
    memset(sendbuf,0,0x200);
    sendbuf[0] = 0xaa;
    sendbuf[1] = (uchar)pPololu->DeviceNumber;
    sendbuf[2] = '\x04';
    sendbuf[4] = (char)uVar1 * '\x04' & 0x7c;
    sendbuf[5] = (byte)(uVar1 >> 5) & 0x7f;
    sendbuf[3] = (uchar)channel;
    iVar2 = WriteAllRS232Port(&pPololu->RS232Port,sendbuf,6);
    if (iVar2 == 0) {
      if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
        fwrite(sendbuf,6,1,(FILE *)pPololu->pfSaveFile);
        fflush((FILE *)pPololu->pfSaveFile);
      }
      pPololu->LastPWs[channel] = uVar1;
      iVar4 = 0;
    }
    else {
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

inline int SetPWMPololu(POLOLU* pPololu, int channel, int pw)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	int target = 0;
	int sendbuflen = 0;

	if (pPololu->bProportionalPWs[channel])
	{
		pw = (int)(pPololu->CoefPWs[channel]*(pw-DEFAULT_MID_PW_POLOLU));
		if (pw >= 0)
			pw = pPololu->MidPWs[channel]+pw*(pPololu->MaxPWs[channel]-pPololu->MidPWs[channel])
			/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
		else
			pw = pPololu->MidPWs[channel]+pw*(pPololu->MinPWs[channel]-pPololu->MidPWs[channel])
			/(DEFAULT_MIN_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
	}
	else
	{
		pw = DEFAULT_MID_PW_POLOLU+(int)(pPololu->CoefPWs[channel]*(pw-DEFAULT_MID_PW_POLOLU));
	}

	pw = max(min(pw, pPololu->MaxPWs[channel]), pPololu->MinPWs[channel]);
	//pw = max(min(pw, DEFAULT_ABSOLUTE_MAX_PW_POLOLU), DEFAULT_ABSOLUTE_MIN_PW_POLOLU);

	// The requested PWM is only applied if it is slightly different from the current value.
	if (abs(pw-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) return EXIT_SUCCESS;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
	sendbuf[1] = (unsigned char)pPololu->DeviceNumber;
	sendbuf[2] = (unsigned char)(SET_TARGET_COMMAND_POLOLU & 0x7F);
	sendbuf[3] = (unsigned char)channel;
	target = pw*4;
	sendbuf[4] = (unsigned char)(target & 0x7F);
	sendbuf[5] = (unsigned char)((target >> 7) & 0x7F);
	sendbuflen = 6;

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	// Update last known value.
	pPololu->LastPWs[channel] = pw;

	return EXIT_SUCCESS;
}